

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvar.c
# Opt level: O1

LispPTR N_OP_fvarn(int n)

{
  DLword *achain;
  ushort uVar1;
  uint uVar2;
  
  achain = MachineState.pvar + n;
  if ((*(ushort *)((ulong)achain ^ 2) & 1) != 0) {
    nnewframe((frameex1 *)(MachineState.pvar + -10),achain,
              *(int *)((long)MachineState.currentfunc +
                      ((((long)n & 0xfffffffffffffffeU) * 2 +
                       (ulong)(byte)*(ushort *)&(MachineState.currentfunc)->field_0xc * 2) -
                      (ulong)(*(ushort *)&(MachineState.currentfunc)->field_0xc >> 6 & 0xfffffffc)))
             );
  }
  uVar1 = *(ushort *)((ulong)achain ^ 2);
  uVar2 = (*(ushort *)((ulong)(achain + 1) ^ 2) & 0xfff) << 0x10 | (uint)uVar1;
  if ((uVar1 & 1) != 0) {
    printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar2);
  }
  return *(LispPTR *)(Lisp_world + uVar2);
}

Assistant:

LispPTR N_OP_fvarn(int n)
/* n is word offset */

{
  DLword *chain; /* keep FVAR slot2 in CurrentFrameExtension */

  chain = PVar + n;

  if (WBITSPTR(chain)->LSB) {
    /* check 15bit of FVAR slot1 in CurrentFrameExtension.
       0: bound
       1: unbound */
    nfvlookup(CURRENTFX, chain, FuncObj);
  }

  return (GetLongWord(
      NativeAligned4FromLAddr(POINTERMASK & (((GETBASEWORD(chain, 1)) << 16) | GETBASEWORD(chain, 0)))));
}